

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

int ConvertWRGBToYUV(fixed_y_t *best_y,fixed_t *best_uv,WebPPicture *picture)

{
  int iVar1;
  uint8_t uVar2;
  int iVar3;
  int r_00;
  int g_00;
  int b_00;
  long in_RDX;
  long in_RSI;
  int b_1;
  int g_1;
  int r_1;
  int off_1;
  int b;
  int g;
  int r;
  int W;
  int off;
  int uv_h;
  int uv_w;
  int h;
  int w;
  fixed_t *best_uv_base;
  uint8_t *dst_v;
  uint8_t *dst_u;
  uint8_t *dst_y;
  int j;
  int i;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_10;
  
  local_28 = *(long *)(in_RDX + 0x10);
  local_30 = *(long *)(in_RDX + 0x18);
  local_38 = *(long *)(in_RDX + 0x20);
  iVar1 = *(int *)(in_RDX + 0xc);
  iVar3 = *(int *)(in_RDX + 8) + 1 >> 1;
  for (local_20 = 0; local_20 < *(int *)(in_RDX + 0xc); local_20 = local_20 + 1) {
    for (local_1c = 0; local_1c < *(int *)(in_RDX + 8); local_1c = local_1c + 1) {
      uVar2 = ConvertRGBToY(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                            in_stack_ffffffffffffff8c);
      *(uint8_t *)(local_28 + local_1c) = uVar2;
    }
    local_28 = local_28 + *(int *)(in_RDX + 0x28);
  }
  local_10 = in_RSI;
  for (local_20 = 0; local_20 < iVar1 + 1 >> 1; local_20 = local_20 + 1) {
    for (local_1c = 0; local_1c < iVar3; local_1c = local_1c + 1) {
      r_00 = (int)*(short *)(local_10 + (long)local_1c * 2);
      g_00 = (int)*(short *)(local_10 + (long)(local_1c + iVar3) * 2);
      b_00 = (int)*(short *)(local_10 + (long)(local_1c + iVar3 * 2) * 2);
      uVar2 = ConvertRGBToU(r_00,g_00,b_00);
      *(uint8_t *)(local_30 + local_1c) = uVar2;
      uVar2 = ConvertRGBToV(r_00,g_00,b_00);
      *(uint8_t *)(local_38 + local_1c) = uVar2;
    }
    local_10 = local_10 + (long)(iVar3 * 3) * 2;
    local_30 = local_30 + *(int *)(in_RDX + 0x2c);
    local_38 = local_38 + *(int *)(in_RDX + 0x2c);
  }
  return 1;
}

Assistant:

static int ConvertWRGBToYUV(const fixed_y_t* best_y, const fixed_t* best_uv,
                            WebPPicture* const picture) {
  int i, j;
  uint8_t* dst_y = picture->y;
  uint8_t* dst_u = picture->u;
  uint8_t* dst_v = picture->v;
  const fixed_t* const best_uv_base = best_uv;
  const int w = (picture->width + 1) & ~1;
  const int h = (picture->height + 1) & ~1;
  const int uv_w = w >> 1;
  const int uv_h = h >> 1;
  for (best_uv = best_uv_base, j = 0; j < picture->height; ++j) {
    for (i = 0; i < picture->width; ++i) {
      const int off = (i >> 1);
      const int W = best_y[i];
      const int r = best_uv[off + 0 * uv_w] + W;
      const int g = best_uv[off + 1 * uv_w] + W;
      const int b = best_uv[off + 2 * uv_w] + W;
      dst_y[i] = ConvertRGBToY(r, g, b);
    }
    best_y += w;
    best_uv += (j & 1) * 3 * uv_w;
    dst_y += picture->y_stride;
  }
  for (best_uv = best_uv_base, j = 0; j < uv_h; ++j) {
    for (i = 0; i < uv_w; ++i) {
      const int off = i;
      const int r = best_uv[off + 0 * uv_w];
      const int g = best_uv[off + 1 * uv_w];
      const int b = best_uv[off + 2 * uv_w];
      dst_u[i] = ConvertRGBToU(r, g, b);
      dst_v[i] = ConvertRGBToV(r, g, b);
    }
    best_uv += 3 * uv_w;
    dst_u += picture->uv_stride;
    dst_v += picture->uv_stride;
  }
  return 1;
}